

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void Unserialize<AutoFile,uint256,long,std::less<uint256>,std::allocator<std::pair<uint256_const,long>>>
               (AutoFile *is,
               map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
               *m)

{
  long lVar1;
  uint uVar2;
  uint64_t uVar3;
  AutoFile *in_RSI;
  long in_FS_OFFSET;
  uint i;
  uint nSize;
  bool in_stack_00000027;
  AutoFile *in_stack_00000028;
  iterator mi;
  pair<uint256,_long> item;
  AutoFile *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar4;
  const_iterator in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>::
  clear((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> *)
        in_stack_ffffffffffffff98);
  uVar3 = ReadCompactSize<AutoFile>(in_stack_00000028,in_stack_00000027);
  uVar2 = (uint)uVar3;
  std::map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>::
  begin((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_> *)
        CONCAT44(uVar2,in_stack_ffffffffffffffa0));
  for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    std::pair<uint256,_long>::pair<uint256,_long,_true>
              ((pair<uint256,_long> *)in_stack_ffffffffffffff98);
    Unserialize<AutoFile,uint256,long>(in_stack_ffffffffffffff98,(pair<uint256,_long> *)0x11e1737);
    in_stack_ffffffffffffff98 = in_RSI;
    std::_Rb_tree_const_iterator<std::pair<const_uint256,_long>_>::_Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<std::pair<const_uint256,_long>_> *)in_RSI,
               (iterator *)0x11e174f);
    std::map<uint256,long,std::less<uint256>,std::allocator<std::pair<uint256_const,long>>>::
    insert<std::pair<uint256,long>&>
              ((map<uint256,_long,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_long>_>_>
                *)CONCAT44(uVar2,uVar4),in_stack_ffffffffffffffb8,
               (pair<uint256,_long> *)in_stack_ffffffffffffff98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& is, std::map<K, T, Pred, A>& m)
{
    m.clear();
    unsigned int nSize = ReadCompactSize(is);
    typename std::map<K, T, Pred, A>::iterator mi = m.begin();
    for (unsigned int i = 0; i < nSize; i++)
    {
        std::pair<K, T> item;
        Unserialize(is, item);
        mi = m.insert(mi, item);
    }
}